

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_py_generator.cc
# Opt level: O3

bool t_py_generator::is_immutable(t_type *ttype)

{
  int iVar1;
  iterator iVar2;
  undefined1 uVar3;
  key_type local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"python.immutable","");
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(ttype->annotations_)._M_t,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if ((_Rb_tree_header *)iVar2._M_node == &(ttype->annotations_)._M_t._M_impl.super__Rb_tree_header)
  {
    iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xc])(ttype);
    uVar3 = (undefined1)iVar1;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)(iVar2._M_node + 2));
    uVar3 = iVar1 != 0;
  }
  return (bool)uVar3;
}

Assistant:

static bool is_immutable(t_type* ttype) {
    std::map<std::string, std::string>::iterator it = ttype->annotations_.find("python.immutable");

    if (it == ttype->annotations_.end()) {
      // Exceptions are immutable by default.
      return ttype->is_xception();
    } else if (it->second == "false") {
      return false;
    } else {
      return true;
    }
  }